

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  bool bVar1;
  TestCaseInfo *pTVar2;
  ostream *this_00;
  ulong uVar3;
  string local_2f8 [32];
  TestCase local_2d8;
  ostringstream local_1c0 [8];
  ostringstream oss;
  string local_38 [8];
  string name;
  TestCase *testCase_local;
  TestRegistry *this_local;
  
  pTVar2 = TestCase::getTestCaseInfo(testCase);
  std::__cxx11::string::string(local_38,(string *)pTVar2);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    this_00 = std::operator<<((ostream *)local_1c0,"Anonymous test case ");
    uVar3 = this->m_unnamedCount + 1;
    this->m_unnamedCount = uVar3;
    std::ostream::operator<<(this_00,uVar3);
    std::__cxx11::ostringstream::str();
    TestCase::withName(&local_2d8,testCase,local_2f8);
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_2d8);
    TestCase::~TestCase(&local_2d8);
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::ostringstream::~ostringstream(local_1c0);
  }
  else {
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

virtual void registerTest(TestCase const& testCase) {
			std::string name = testCase.getTestCaseInfo().name;
			if (name == "") {
				std::ostringstream oss;
				oss << "Anonymous test case " << ++m_unnamedCount;
				return registerTest(testCase.withName(oss.str()));
			}
			m_functions.push_back(testCase);
		}